

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

Statement *
slang::ast::Statement::bindItems
          (SyntaxList<slang::syntax::SyntaxNode> *items,ASTContext *context,
          StatementContext *stmtCtx)

{
  pointer ppSVar1;
  size_t sVar2;
  SyntaxKind *pSVar3;
  Compilation *this;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StatementList *pSVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  SmallVector<const_slang::ast::Statement_*,_5UL> *results;
  SmallVector<const_slang::ast::Statement_*,_5UL> *ctx;
  long lVar7;
  undefined1 local_98 [16];
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  SourceRange local_48;
  
  ctx = (SmallVector<const_slang::ast::Statement_*,_5UL> *)local_98;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  results = &buffer;
  bindScopeInitializers(context,&results->super_SmallVectorBase<const_slang::ast::Statement_*>);
  ppSVar1 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_ptr;
  sVar2 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  src = extraout_RDX;
  for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    pSVar3 = *(SyntaxKind **)((long)ppSVar1 + lVar7);
    bVar4 = slang::syntax::StatementSyntax::isKind(*pSVar3);
    src = extraout_RDX_00;
    if (bVar4) {
      iVar5 = bind((int)pSVar3,(sockaddr *)context,(socklen_t)stmtCtx);
      local_98._0_8_ = CONCAT44(extraout_var,iVar5);
      results = (SmallVector<const_slang::ast::Statement_*,_5UL> *)local_98;
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)&buffer,(Statement **)local_98);
      src = extraout_RDX_01;
    }
  }
  if (buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.len == 1) {
    pSVar6 = (StatementList *)*buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.data_;
    ctx = results;
  }
  else {
    this = ((context->scope).ptr)->compilation;
    iVar5 = SmallVectorBase<const_slang::ast::Statement_*>::copy
                      (&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,
                       (EVP_PKEY_CTX *)this,src);
    local_98._0_8_ = CONCAT44(extraout_var_00,iVar5);
    local_48.startLoc = (SourceLocation)0x0;
    local_48.endLoc = (SourceLocation)0x0;
    pSVar6 = BumpAllocator::
             emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*,18446744073709551615ul>,slang::SourceRange>
                       (&this->super_BumpAllocator,
                        (span<const_slang::ast::Statement_*,_18446744073709551615UL> *)local_98,
                        &local_48);
  }
  SmallVectorBase<const_slang::ast::Statement_*>::cleanup
            (&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,(EVP_PKEY_CTX *)ctx);
  return &pSVar6->super_Statement;
}

Assistant:

const Statement& Statement::bindItems(const SyntaxList<SyntaxNode>& items,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Statement*> buffer;
    bindScopeInitializers(context, buffer);

    for (auto item : items) {
        if (StatementSyntax::isKind(item->kind)) {
            buffer.push_back(&bind(item->as<StatementSyntax>(), context, stmtCtx,
                                   /* inList */ true));
        }
    }

    if (buffer.size() == 1)
        return *buffer[0];

    auto& comp = context.getCompilation();
    return *comp.emplace<StatementList>(buffer.copy(comp), SourceRange());
}